

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

TidyParserMemory * prvTidypopMemory(TidyParserMemory *__return_storage_ptr__,TidyDocImpl *doc)

{
  Bool BVar1;
  TidyParserMemory *data;
  TidyDocImpl *doc_local;
  
  BVar1 = prvTidyisEmptyParserStack(doc);
  if (BVar1 == no) {
    memcpy(__return_storage_ptr__,(doc->stack).content + (doc->stack).top,0x30);
    (doc->stack).top = (doc->stack).top + -1;
  }
  else {
    memset(__return_storage_ptr__,0,0x30);
  }
  return __return_storage_ptr__;
}

Assistant:

TidyParserMemory TY_(popMemory)( TidyDocImpl* doc )
{
    if ( !TY_(isEmptyParserStack)( doc ) )
    {
        TidyParserMemory data = doc->stack.content[doc->stack.top];
        DEBUG_LOG(SPRTF("\n"
                        "<--POP  original: %s @ %p\n"
                        "         reentry: %s @ %p\n"
                        "     stack depth: %lu @ %p\n"
                        "            mode: %u\n"
                        "      register 1: %i\n"
                        "      register 2: %i\n\n",
                        data.original_node ? data.original_node->element : "none", data.original_node,
                        data.reentry_node ? data.reentry_node->element : "none", data.reentry_node,
                        doc->stack.top, &doc->stack.content[doc->stack.top],
                        data.mode,
                        data.register_1,
                        data.register_2
                        ));
        doc->stack.top = doc->stack.top - 1;
        return data;
    }
    TidyParserMemory blank = { NULL };
    return blank;
}